

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::ExclusiveBetweenOperator,true,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  if (count == 0) {
    iVar16 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = true_sel->sel_vector;
    psVar6 = false_sel->sel_vector;
    iVar16 = 0;
    lVar15 = 0;
    uVar12 = 0;
    do {
      uVar8 = uVar12;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar12];
      }
      uVar9 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar12];
      }
      uVar11 = uVar12;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar12];
      }
      uVar13 = uVar12;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar12];
      }
      lVar19._0_4_ = adata[uVar9].months;
      lVar19._4_4_ = adata[uVar9].days;
      lVar14._0_4_ = bdata[uVar11].months;
      lVar14._4_4_ = bdata[uVar11].days;
      lVar10 = (lVar19 >> 0x20) + adata[uVar9].micros / 86400000000;
      lVar18 = adata[uVar9].micros % 86400000000;
      lVar17 = lVar10 % 0x1e;
      lVar20 = (long)(int)(undefined4)lVar19 + lVar10 / 0x1e;
      lVar19 = (lVar14 >> 0x20) + bdata[uVar11].micros / 86400000000;
      lVar10._0_4_ = cdata[uVar13].months;
      lVar10._4_4_ = cdata[uVar13].days;
      lVar14 = (long)(int)(undefined4)lVar14 + lVar19 / 0x1e;
      if (lVar14 < lVar20) {
LAB_003ea60e:
        lVar14 = (lVar10 >> 0x20) + cdata[uVar13].micros / 86400000000;
        lVar19 = (long)(int)(undefined4)lVar10 + lVar14 / 0x1e;
        bVar7 = true;
        if (lVar19 <= lVar20) {
          if (lVar19 < lVar20) goto LAB_003ea695;
          lVar14 = lVar14 % 0x1e;
          if (lVar14 <= lVar17) {
            bVar7 = lVar18 < cdata[uVar13].micros % 86400000000 && lVar17 <= lVar14;
          }
        }
      }
      else if (lVar20 < lVar14) {
LAB_003ea695:
        bVar7 = false;
      }
      else {
        lVar19 = lVar19 % 0x1e;
        if ((lVar19 < lVar17) ||
           ((bVar7 = false, lVar19 <= lVar17 && (bdata[uVar11].micros % 86400000000 < lVar18))))
        goto LAB_003ea60e;
      }
      psVar5[iVar16] = (sel_t)uVar8;
      iVar16 = iVar16 + bVar7;
      psVar6[lVar15] = (sel_t)uVar8;
      lVar15 = lVar15 + (ulong)(bVar7 ^ 1);
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return iVar16;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}